

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

int opus_picture_tag_parse(OpusPictureTag *_pic,char *_tag)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  opus_uint32 oVar6;
  opus_uint32 oVar7;
  opus_uint32 oVar8;
  opus_uint32 oVar9;
  int iVar10;
  int iVar11;
  opus_uint32 oVar12;
  size_t sVar13;
  uchar *_data;
  long lVar14;
  char *__dest;
  uchar *puVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ushort uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  opus_uint32 local_d8;
  opus_uint32 local_d4;
  opus_uint32 local_d0;
  opus_uint32 local_c0;
  int local_ac;
  opus_uint32 local_9c;
  OpusPictureTag pic;
  
  iVar5 = opus_tagncompare("METADATA_BLOCK_PICTURE",0x16,_tag);
  pcVar25 = _tag + 0x17;
  if (iVar5 != 0) {
    pcVar25 = _tag;
  }
  sVar13 = strlen(pcVar25);
  if ((sVar13 & 3) != 0) {
    return -0x84;
  }
  if (sVar13 < 0x2c) {
    return -0x84;
  }
  uVar23 = ((sVar13 >> 2) * 3 - (ulong)(pcVar25[sVar13 - 1] == '=')) -
           (ulong)(pcVar25[sVar13 - 2] == '=');
  if (uVar23 < 0x20) {
    return -0x84;
  }
  _data = (uchar *)malloc(uVar23 + 1);
  if (_data == (uchar *)0x0) {
    return -0x81;
  }
  pic.data = (uchar *)0x0;
  pic.format = 0;
  pic._60_4_ = 0;
  pic.depth = 0;
  pic.colors = 0;
  pic.data_length = 0;
  pic._44_4_ = 0;
  pic.description = (char *)0x0;
  pic.width = 0;
  pic.height = 0;
  pic.type = 0;
  pic._4_4_ = 0;
  pic.mime_type._0_4_ = 0;
  pic.mime_type._4_4_ = 0;
  lVar14 = 0;
  iVar5 = -0x84;
  for (uVar17 = 0; uVar17 != sVar13 >> 2; uVar17 = uVar17 + 1) {
    lVar24 = uVar17 * 3;
    uVar16 = 0;
    for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
      bVar1 = pcVar25[lVar21];
      uVar22 = 0x3e;
      if (bVar1 != 0x2b) {
        if (bVar1 == 0x2f) {
          uVar22 = 0x3f;
        }
        else {
          uVar22 = (uint)bVar1;
          if ((byte)(bVar1 - 0x30) < 10) {
            uVar22 = uVar22 + 4;
          }
          else if ((byte)(bVar1 + 0x9f) < 0x1a) {
            uVar22 = uVar22 - 0x47;
          }
          else if ((byte)(bVar1 + 0xbf) < 0x1a) {
            uVar22 = uVar22 - 0x41;
          }
          else if ((uVar22 != 0x3d) || (uVar22 = 0, (ulong)(lVar14 + lVar21) <= uVar23))
          goto LAB_001054b2;
        }
      }
      uVar16 = uVar16 << 6 | uVar22;
    }
    _data[lVar24] = (uchar)(uVar16 >> 0x10);
    if (lVar24 + 1U < uVar23) {
      _data[lVar24 + 1] = (uchar)(uVar16 >> 8);
      if (lVar24 + 2U < uVar23) {
        _data[lVar24 + 2U] = (uchar)uVar16;
      }
    }
    pcVar25 = pcVar25 + 4;
    lVar14 = lVar14 + 3;
  }
  oVar6 = op_parse_uint32be(_data);
  oVar7 = op_parse_uint32be(_data + 4);
  uVar17 = (ulong)oVar7;
  iVar5 = -0x84;
  if (uVar23 - 0x20 < uVar17) goto LAB_001054b2;
  pcVar25 = (char *)malloc((ulong)(oVar7 + 1));
  if (pcVar25 == (char *)0x0) {
LAB_001054ac:
    iVar5 = -0x81;
    goto LAB_001054b2;
  }
  memcpy(pcVar25,_data + 8,uVar17);
  pcVar25[uVar17] = '\0';
  pic.mime_type._0_4_ = SUB84(pcVar25,0);
  pic.mime_type._4_4_ = (undefined4)((ulong)pcVar25 >> 0x20);
  oVar7 = op_parse_uint32be(_data + uVar17 + 8);
  uVar18 = (ulong)oVar7;
  if ((uVar23 - 0x20) - uVar17 < uVar18) goto LAB_001054b2;
  __dest = (char *)malloc((ulong)(oVar7 + 1));
  if (__dest == (char *)0x0) goto LAB_001054ac;
  memcpy(__dest,_data + uVar17 + 0xc,uVar18);
  __dest[uVar18] = '\0';
  lVar14 = uVar17 + 0xc + uVar18;
  pic.description = __dest;
  oVar8 = op_parse_uint32be(_data + lVar14);
  local_c0 = op_parse_uint32be(_data + lVar14 + 4);
  oVar7 = op_parse_uint32be(_data + lVar14 + 8);
  local_d8 = op_parse_uint32be(_data + lVar14 + 0xc);
  if ((oVar7 == 0 || (local_c0 == 0 || oVar8 == 0)) &&
     (((oVar8 != 0 || local_c0 != 0) || oVar7 != 0) || local_d8 != 0)) goto LAB_001054b2;
  oVar9 = op_parse_uint32be(_data + lVar14 + 0x10);
  lVar14 = lVar14 + 0x14;
  uVar18 = (ulong)oVar9;
  if (uVar23 - lVar14 < uVar18) goto LAB_001054b2;
  lVar24 = lVar14 + uVar18;
  iVar11 = -1;
  local_ac = -1;
  bVar4 = true;
  bVar3 = true;
  switch(uVar17) {
  case 0:
    break;
  default:
switchD_0010544d_caseD_1:
    bVar3 = true;
    goto LAB_001058b1;
  case 3:
    iVar10 = strcmp(pcVar25,"-->");
    if (iVar10 != 0) goto switchD_0010544d_caseD_1;
    if ((oVar6 == 1 && (oVar8 != 0 || local_c0 != 0)) && (local_c0 != 0x20 || oVar8 != 0x20))
    goto LAB_001054b2;
    _data[lVar24] = '\0';
    lVar24 = lVar24 + 1;
    local_ac = 0;
    goto LAB_001058e9;
  case 6:
    iVar10 = op_strncasecmp(pcVar25,"image/",6);
    if (iVar10 != 0) goto switchD_0010544d_caseD_1;
    break;
  case 9:
    iVar10 = op_strncasecmp(pcVar25,"image/png",9);
    if (iVar10 == 0) {
      iVar10 = op_is_png(_data + lVar14,uVar18);
      iVar11 = local_ac;
      if (iVar10 == 0) goto LAB_001058b1;
      goto LAB_0010562d;
    }
    iVar10 = op_strncasecmp(pcVar25,"image/gif",9);
    bVar3 = bVar4;
    if (iVar10 != 0) goto LAB_001058b1;
    goto LAB_00105588;
  case 10:
    iVar10 = op_strncasecmp(pcVar25,"image/jpeg",10);
    if (iVar10 != 0) goto switchD_0010544d_caseD_1;
    iVar10 = op_is_jpeg(_data + lVar14,uVar18);
    bVar3 = bVar4;
    if (iVar10 == 0) goto LAB_001058b1;
    goto LAB_00105742;
  }
  iVar10 = op_is_jpeg(_data + lVar14,uVar18);
  if (iVar10 == 0) {
    iVar10 = op_is_png(_data + lVar14,uVar18);
    if (iVar10 == 0) {
LAB_00105588:
      iVar10 = op_is_gif(_data + lVar14,uVar18);
      bVar3 = bVar4;
      if (iVar10 != 0) {
        puVar15 = _data + lVar14;
        iVar10 = op_is_gif(puVar15,uVar18);
        local_ac = 3;
        iVar11 = local_ac;
        if ((0xd < oVar9) && (iVar10 != 0)) {
          local_c0 = (opus_uint32)*(ushort *)(puVar15 + 8);
          local_d8 = 1 << (puVar15[10] & 7) + 1;
          oVar8 = (uint)*(ushort *)(puVar15 + 6);
          iVar11 = 3;
          oVar7 = 0x18;
        }
      }
    }
    else {
LAB_0010562d:
      iVar11 = 2;
      local_ac = 2;
      iVar10 = op_is_png(_data + lVar14,uVar18);
      local_d0 = 0;
      if (iVar10 == 0) {
        bVar3 = false;
        iVar11 = local_ac;
      }
      else {
        iVar10 = -1;
        local_d4 = 0;
        local_9c = 0;
        for (lVar21 = 8; 0xb < uVar18 - lVar21; lVar21 = lVar21 + (ulong)(oVar12 + 0xc)) {
          puVar15 = _data + lVar14 + lVar21;
          oVar12 = op_parse_uint32be(puVar15);
          if ((uVar18 - 0xc) - lVar21 < (ulong)oVar12) break;
          if ((oVar12 == 0xd) && (*(int *)(puVar15 + 4) == 0x52444849)) {
            local_d0 = op_parse_uint32be(puVar15 + 8);
            local_d4 = op_parse_uint32be(puVar15 + 0xc);
            bVar1 = puVar15[0x11];
            if (bVar1 != 3) {
              if (6 < bVar1) goto switchD_00105a47_caseD_1;
              bVar2 = puVar15[0x10];
              uVar16 = (uint)bVar2;
              switch(bVar1) {
              case 0:
                break;
              default:
                goto switchD_00105a47_caseD_1;
              case 2:
                uVar16 = (uint)bVar2 * 3;
                break;
              case 4:
                uVar16 = (uint)bVar2 * 2;
                break;
              case 6:
                uVar16 = (uint)bVar2 << 2;
              }
              local_9c = uVar16;
              goto LAB_00105845;
            }
            local_9c = 0x18;
            iVar10 = 1;
          }
          else if ((0 < iVar10) && (*(int *)(puVar15 + 4) == 0x45544c50)) {
            local_d8 = oVar12 / 3;
            local_c0 = local_d4;
            oVar8 = local_d0;
            oVar7 = local_9c;
            bVar3 = false;
            goto LAB_001058b1;
          }
        }
        bVar3 = false;
        if (-1 < iVar10) {
switchD_00105a47_caseD_1:
LAB_00105845:
          local_c0 = local_d4;
          local_d8 = 0;
          oVar8 = local_d0;
          oVar7 = local_9c;
          bVar3 = false;
        }
      }
    }
  }
  else {
LAB_00105742:
    puVar15 = _data + lVar14;
    iVar10 = op_is_jpeg(puVar15,uVar18);
    local_ac = 1;
    iVar11 = 1;
    bVar3 = bVar4;
    if (iVar10 != 0) {
      uVar23 = 2;
      do {
        do {
          uVar17 = uVar18;
          if (uVar18 < uVar23) {
            uVar17 = uVar23;
          }
          for (; (uVar19 = uVar17, uVar17 != uVar23 && (uVar19 = uVar23, puVar15[uVar23] != 0xff));
              uVar23 = uVar23 + 1) {
          }
          uVar23 = uVar18;
          if (uVar18 < uVar19) {
            uVar23 = uVar19;
          }
          for (; uVar23 != uVar19; uVar19 = uVar19 + 1) {
            bVar1 = puVar15[uVar19];
            if (bVar1 != 0xff) goto LAB_001057ac;
          }
          bVar1 = puVar15[uVar23];
          uVar19 = uVar23;
LAB_001057ac:
          uVar23 = uVar19 + 1;
          iVar11 = local_ac;
          if ((uVar18 <= uVar23) || ((byte)(bVar1 + 0x28) < 3)) goto LAB_001058b1;
        } while ((bVar1 & 0xf8) == 0xd0);
        if (((uVar18 - uVar23 < 2) ||
            (uVar20 = *(ushort *)(puVar15 + uVar19 + 1) << 8 |
                      *(ushort *)(puVar15 + uVar19 + 1) >> 8, uVar20 < 2)) ||
           (uVar18 - uVar23 < (ulong)uVar20)) break;
        if ((bVar1 == 0xc0) || ((bVar1 & 3) != 0 && 0xf0 < (byte)(bVar1 + 0x30))) {
          if (7 < uVar20) {
            local_c0 = (opus_uint32)
                       (ushort)(*(ushort *)(puVar15 + uVar19 + 4) << 8 |
                               *(ushort *)(puVar15 + uVar19 + 4) >> 8);
            local_d8 = 0;
            oVar8 = (uint)(ushort)(*(ushort *)(puVar15 + uVar19 + 6) << 8 |
                                  *(ushort *)(puVar15 + uVar19 + 6) >> 8);
            iVar11 = 1;
            oVar7 = (uint)puVar15[uVar19 + 8] * (uint)puVar15[uVar19 + 3];
            bVar3 = true;
          }
          break;
        }
        uVar23 = uVar23 + uVar20;
      } while( true );
    }
  }
LAB_001058b1:
  local_ac = iVar11;
  if (oVar6 == 1) {
    if ((bVar3 || oVar8 != 0x20) || (local_c0 != 0x20)) goto LAB_001054b2;
    local_ac = 2;
    oVar8 = 0x20;
    local_c0 = 0x20;
  }
LAB_001058e9:
  memmove(_data,_data + lVar14,lVar24 - lVar14);
  puVar15 = (uchar *)realloc(_data,lVar24 - lVar14);
  if ((lVar24 == lVar14) || (iVar5 = -0x81, puVar15 != (uchar *)0x0)) {
    _pic->data = puVar15;
    _pic->format = local_ac;
    *(undefined4 *)&_pic->field_0x3c = pic._60_4_;
    _pic->type = oVar6;
    *(ulong *)&_pic->field_0x4 = CONCAT44(pic.mime_type._0_4_,pic._4_4_);
    *(undefined4 *)((long)&_pic->mime_type + 4) = pic.mime_type._4_4_;
    _pic->depth = oVar7;
    _pic->colors = local_d8;
    _pic->data_length = oVar9;
    *(undefined4 *)&_pic->field_0x2c = pic._44_4_;
    _pic->description = pic.description;
    _pic->width = oVar8;
    _pic->height = local_c0;
    return 0;
  }
LAB_001054b2:
  opus_picture_tag_clear(&pic);
  free(_data);
  return iVar5;
}

Assistant:

int opus_picture_tag_parse(OpusPictureTag *_pic,const char *_tag){
  OpusPictureTag  pic;
  unsigned char  *buf;
  size_t          base64_sz;
  size_t          buf_sz;
  size_t          tag_length;
  int             ret;
  if(opus_tagncompare("METADATA_BLOCK_PICTURE",22,_tag)==0)_tag+=23;
  /*Figure out how much BASE64-encoded data we have.*/
  tag_length=strlen(_tag);
  if(tag_length&3)return OP_ENOTFORMAT;
  base64_sz=tag_length>>2;
  buf_sz=3*base64_sz;
  if(buf_sz<32)return OP_ENOTFORMAT;
  if(_tag[tag_length-1]=='=')buf_sz--;
  if(_tag[tag_length-2]=='=')buf_sz--;
  if(buf_sz<32)return OP_ENOTFORMAT;
  /*Allocate an extra byte to allow appending a terminating NUL to URL data.*/
  buf=(unsigned char *)_ogg_malloc(sizeof(*buf)*(buf_sz+1));
  if(buf==NULL)return OP_EFAULT;
  opus_picture_tag_init(&pic);
  ret=opus_picture_tag_parse_impl(&pic,_tag,buf,buf_sz,base64_sz);
  if(ret<0){
    opus_picture_tag_clear(&pic);
    _ogg_free(buf);
  }
  else *_pic=*&pic;
  return ret;
}